

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O1

Time __thiscall
helics::CommonCore::timeRequest(CommonCore *this,LocalFederateId federateID,Time next)

{
  int iVar1;
  FederateStates FVar2;
  FederateState *this_00;
  InvalidFunctionCall *this_01;
  HelicsException *this_02;
  undefined **ppuVar3;
  char *pcVar4;
  size_t sVar5;
  pointer_____offset_0x10___ *ppuVar6;
  Time TVar7;
  bool bVar8;
  string_view message;
  string_view message_00;
  string_view message_01;
  iteration_time iVar9;
  ActionMessage terminate;
  ActionMessage AStack_e8;
  
  this_00 = getFederateAt(this,federateID);
  if (this_00 == (FederateState *)0x0) {
    this_01 = (InvalidFunctionCall *)__cxa_allocate_exception(0x28);
    message._M_str = "federateID not valid timeRequest";
    message._M_len = 0x20;
    InvalidIdentifier::InvalidIdentifier((InvalidIdentifier *)this_01,message);
    ppuVar6 = &InvalidIdentifier::typeinfo;
  }
  else {
    if (this_00->mCallbackBased == true) {
      this_01 = (InvalidFunctionCall *)__cxa_allocate_exception(0x28);
      pcVar4 = "Time request operation is not permitted for callback based federates";
      sVar5 = 0x44;
    }
    else {
      if ((ushort)((this->super_BrokerBase).brokerState._M_i + CONNECTED) < 5) {
        ActionMessage::ActionMessage(&AStack_e8,cmd_stop);
        AStack_e8.dest_id.gid = (this_00->global_id)._M_i.gid;
        AStack_e8.source_id.gid = (this_00->global_id)._M_i.gid;
        FederateState::addAction(this_00,&AStack_e8);
        ActionMessage::~ActionMessage(&AStack_e8);
      }
      FVar2 = FederateState::getState(this_00);
      if (FVar2 == FINISHED) {
        return (Time)0x7fffffffffffffff;
      }
      if (FVar2 == EXECUTING) {
        ActionMessage::ActionMessage(&AStack_e8,cmd_time_request);
        AStack_e8.source_id.gid = (this_00->global_id)._M_i.gid;
        AStack_e8.dest_id.gid = (this_00->global_id)._M_i.gid;
        AStack_e8.flags._0_1_ = (byte)AStack_e8.flags | 0x20;
        AStack_e8.actionTime.internalTimeCode = next.internalTimeCode;
        BrokerBase::addActionMessage(&this->super_BrokerBase,&AStack_e8);
        iVar9 = FederateState::requestTime(this_00,next,NO_ITERATIONS,false);
        TVar7.internalTimeCode = 0x7fffffffffffffff;
        if ((iVar9.state != HALTED) &&
           (TVar7.internalTimeCode = iVar9.grantedTime.internalTimeCode.internalTimeCode,
           iVar9.state == ERROR_RESULT)) {
          iVar1 = this_00->errorCode;
          this_02 = (HelicsException *)__cxa_allocate_exception(0x28);
          message_01._M_str = (this_00->errorString)._M_dataplus._M_p;
          message_01._M_len = (this_00->errorString)._M_string_length;
          HelicsException::HelicsException(this_02,message_01);
          bVar8 = iVar1 != -1;
          ppuVar3 = &PTR__HelicsException_004cb6a0;
          if (bVar8) {
            ppuVar3 = &PTR__HelicsException_004db738;
          }
          ppuVar6 = &FunctionExecutionFailure::typeinfo;
          if (!bVar8) {
            ppuVar6 = &RegistrationFailure::typeinfo;
          }
          *(undefined ***)this_02 = ppuVar3;
          __cxa_throw(this_02,ppuVar6,HelicsException::~HelicsException);
        }
        ActionMessage::~ActionMessage(&AStack_e8);
        return (Time)TVar7.internalTimeCode;
      }
      this_01 = (InvalidFunctionCall *)__cxa_allocate_exception(0x28);
      pcVar4 = "time request should only be called in execution state";
      sVar5 = 0x35;
    }
    message_00._M_str = pcVar4;
    message_00._M_len = sVar5;
    InvalidFunctionCall::InvalidFunctionCall(this_01,message_00);
    ppuVar6 = &InvalidFunctionCall::typeinfo;
  }
  __cxa_throw(this_01,ppuVar6,HelicsException::~HelicsException);
}

Assistant:

Time CommonCore::timeRequest(LocalFederateId federateID, Time next)
{
    auto* fed = getFederateAt(federateID);
    if (fed == nullptr) {
        throw(InvalidIdentifier("federateID not valid timeRequest"));
    }
    if (fed->isCallbackFederate()) {
        throw(InvalidFunctionCall(
            "Time request operation is not permitted for callback based federates"));
    }
    auto cBrokerState = getBrokerState();
    switch (cBrokerState) {
        case BrokerState::TERMINATING:
        case BrokerState::TERMINATED:
        case BrokerState::TERMINATING_ERROR:
        case BrokerState::CONNECTED_ERROR:
        case BrokerState::ERRORED: {
            ActionMessage terminate(CMD_STOP);
            terminate.dest_id = fed->global_id;
            terminate.source_id = fed->global_id;
            fed->addAction(terminate);
        } break;
        default:
            break;
    }
    switch (fed->getState()) {
        case FederateStates::EXECUTING: {
            // generate the request through the core
            ActionMessage treq(CMD_TIME_REQUEST);
            treq.source_id = fed->global_id.load();
            treq.dest_id = fed->global_id.load();
            treq.actionTime = next;
            setActionFlag(treq, indicator_flag);
            addActionMessage(treq);
            auto ret = fed->requestTime(next, IterationRequest::NO_ITERATIONS, false);

            switch (ret.state) {
                case IterationResult::ERROR_RESULT:
                    switch (fed->lastErrorCode()) {
                        case HELICS_ERROR_REGISTRATION_FAILURE:
                            throw(RegistrationFailure(fed->lastErrorString()));
                        default:
                            throw(FunctionExecutionFailure(fed->lastErrorString()));
                    }

                case IterationResult::HALTED:
                    return Time::maxVal();
                default:
                    return ret.grantedTime;
            }
        }
        case FederateStates::FINISHED:
            return Time::maxVal();
        default:
            throw(InvalidFunctionCall("time request should only be called in execution state"));
    }
}